

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall CommandDrawString::SetStringToTag(CommandDrawString *this,AActor *actor)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *copyStr;
  PClass *pPVar2;
  
  if (actor == (AActor *)0x0) {
    this->cache = -1;
    FString::operator=(&this->str,(char *)"");
    return;
  }
  pPVar2 = (actor->super_DThinker).super_DObject.Class;
  if (pPVar2 == (PClass *)0x0) {
    iVar1 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
    (actor->super_DThinker).super_DObject.Class = pPVar2;
  }
  if ((PClass *)this->cache == pPVar2) {
    return;
  }
  if (pPVar2 == (PClass *)0x0) {
    iVar1 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
    pPVar2 = (PClass *)CONCAT44(extraout_var_00,iVar1);
    (actor->super_DThinker).super_DObject.Class = pPVar2;
  }
  this->cache = (intptr_t)pPVar2;
  copyStr = AActor::GetTag(actor,(char *)0x0);
  FString::operator=(&this->str,copyStr);
  RealignString(this);
  return;
}

Assistant:

void SetStringToTag(AActor *actor)
		{
			if (actor != NULL)
			{
				if ((intptr_t)actor->GetClass() != cache)
				{
					cache = (intptr_t)actor->GetClass();
					str = actor->GetTag();
					RealignString();
				}
			}
			else
			{
				cache = -1;
				str = "";
			}
		}